

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O3

void on_session_state_changed
               (void *context,SESSION_STATE new_session_state,SESSION_STATE previous_session_state)

{
  int iVar1;
  code *UNRECOVERED_JUMPTABLE;
  role in_CL;
  undefined8 uVar2;
  undefined8 uVar3;
  
  if (new_session_state == SESSION_STATE_ERROR) {
    remove_all_pending_deliveries((LINK_INSTANCE *)context,true);
    *(undefined4 *)((long)context + 0xc) = *(undefined4 *)((long)context + 8);
    *(undefined4 *)((long)context + 8) = 5;
    UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x48);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      uVar3 = *(undefined8 *)((long)context + 0x60);
      uVar2 = 5;
LAB_00168fe4:
      (*UNRECOVERED_JUMPTABLE)(uVar3,uVar2);
      return;
    }
  }
  else if (new_session_state == SESSION_STATE_DISCARDING) {
    remove_all_pending_deliveries((LINK_INSTANCE *)context,true);
    *(undefined4 *)((long)context + 0xc) = *(undefined4 *)((long)context + 8);
    *(undefined4 *)((long)context + 8) = 1;
    UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x48);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      uVar3 = *(undefined8 *)((long)context + 0x60);
      uVar2 = 1;
      goto LAB_00168fe4;
    }
  }
  else if (((new_session_state == SESSION_STATE_MAPPED) && (*(int *)((long)context + 8) == 1)) &&
          (*(char *)((long)context + 0x99) == '\0')) {
    iVar1 = send_attach((LINK_INSTANCE *)context,*(char **)((long)context + 0x30),
                        (uint)*(byte *)((long)context + 0x44),in_CL);
    if (iVar1 == 0) {
      *(undefined4 *)((long)context + 0xc) = *(undefined4 *)((long)context + 8);
      *(undefined4 *)((long)context + 8) = 2;
      UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x48);
      if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
        uVar3 = *(undefined8 *)((long)context + 0x60);
        uVar2 = 2;
        goto LAB_00168fe4;
      }
    }
  }
  return;
}

Assistant:

static void on_session_state_changed(void* context, SESSION_STATE new_session_state, SESSION_STATE previous_session_state)
{
    LINK_INSTANCE* link_instance = (LINK_INSTANCE*)context;
    (void)previous_session_state;

    if (new_session_state == SESSION_STATE_MAPPED)
    {
        if ((link_instance->link_state == LINK_STATE_DETACHED) && (!link_instance->is_closed))
        {
            if (send_attach(link_instance, link_instance->name, 0, link_instance->role) == 0)
            {
                set_link_state(link_instance, LINK_STATE_HALF_ATTACHED_ATTACH_SENT);
            }
        }
    }
    else if (new_session_state == SESSION_STATE_DISCARDING)
    {
        remove_all_pending_deliveries(link_instance, true);
        set_link_state(link_instance, LINK_STATE_DETACHED);
    }
    else if (new_session_state == SESSION_STATE_ERROR)
    {
        remove_all_pending_deliveries(link_instance, true);
        set_link_state(link_instance, LINK_STATE_ERROR);
    }
}